

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O1

void __thiscall
ritobin::io::text_write_impl::BinTextWriter::write_type_visit(BinTextWriter *this,Map *value)

{
  string_view sVar1;
  
  sVar1._M_str = "map";
  sVar1._M_len = 3;
  TextWriter::write_raw(&this->writer,sVar1);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x13b212);
  sVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
          ::type_to_type_name(value->keyType);
  TextWriter::write_raw(&this->writer,sVar1);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])",");
  sVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
          ::type_to_type_name(value->valueType);
  TextWriter::write_raw(&this->writer,sVar1);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x13a700);
  return;
}

Assistant:

void write_type_visit(Map const& value) noexcept {
            writer.write(value.type);
            writer.write_raw("[");
            writer.write(value.keyType);
            writer.write_raw(",");
            writer.write(value.valueType);
            writer.write_raw("]");
        }